

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O2

Type * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
ReleaseLastInternal<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
          (RepeatedPtrFieldBase *this)

{
  Type *pTVar1;
  
  pTVar1 = UnsafeArenaReleaseLast<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (this);
  if (this->arena_ != (Arena *)0x0) {
    pTVar1 = copy<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>(pTVar1);
    return pTVar1;
  }
  return pTVar1;
}

Assistant:

inline typename TypeHandler::Type* RepeatedPtrFieldBase::ReleaseLastInternal(
    std::true_type) {
  // First, release an element.
  typename TypeHandler::Type* result = UnsafeArenaReleaseLast<TypeHandler>();
  // Now perform a copy if we're on an arena.
  Arena* arena = GetArena();

  typename TypeHandler::Type* new_result;
#ifdef PROTOBUF_FORCE_COPY_IN_RELEASE
  new_result = copy<TypeHandler>(result);
  if (arena == nullptr) delete result;
#else   // PROTOBUF_FORCE_COPY_IN_RELEASE
  new_result = (arena == nullptr) ? result : copy<TypeHandler>(result);
#endif  // !PROTOBUF_FORCE_COPY_IN_RELEASE
  return new_result;
}